

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryProgramQueryCase::init
          (GeometryProgramQueryCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  ContextType ctxType;
  ApiType requiredApiType;
  ContextInfo *this_00;
  undefined7 extraout_var;
  RenderContext *pRVar3;
  undefined7 extraout_var_00;
  NotSupportedError *this_01;
  GeometryProgramQueryCase *this_local;
  int iVar2;
  
  this_00 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_EXT_geometry_shader");
  iVar2 = (int)CONCAT71(extraout_var,bVar1);
  if (!bVar1) {
    pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    ctxType.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
    requiredApiType = glu::ApiType::es(3,2);
    bVar1 = glu::contextSupports(ctxType,requiredApiType);
    iVar2 = (int)CONCAT71(extraout_var_00,bVar1);
    if (!bVar1) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,"Tests require GL_EXT_geometry_shader extension or higher context version."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                 ,0xf6f);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  return iVar2;
}

Assistant:

void GeometryProgramQueryCase::init (void)
{
	if (!(m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader") || glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2))))
		TCU_THROW(NotSupportedError, "Tests require GL_EXT_geometry_shader extension or higher context version.");
}